

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_chain_add(llama_sampler *chain,llama_sampler *smpl)

{
  llama_sampler *local_8;
  
  local_8 = smpl;
  std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::push_back
            ((vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *)((long)chain->ctx + 8),
             &local_8);
  return;
}

Assistant:

void llama_sampler_chain_add(struct llama_sampler * chain, struct llama_sampler * smpl) {
    auto * p = (llama_sampler_chain *) chain->ctx;
    p->samplers.push_back(smpl);
}